

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Ptr * wabt::interp::Instance::Instantiate
                (Ptr *__return_storage_ptr__,Store *store,Ref module,RefVec *imports,Ptr *out_trap)

{
  Value value;
  uint uVar1;
  u32 uVar2;
  bool bVar3;
  Result result_00;
  u32 uVar4;
  Module *pMVar5;
  ModuleDesc *pMVar6;
  value_type *pvVar7;
  const_reference pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Extern *pEVar11;
  Instance *pIVar12;
  pointer pEVar13;
  Instance *this;
  Features *this_00;
  reference this_01;
  ElemDesc *pEVar14;
  Table *pTVar15;
  ulong uVar16;
  reference this_02;
  DataDesc *pDVar17;
  reference pvVar18;
  Memory *pMVar19;
  u64 uVar20;
  Func *this_03;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_6a0;
  Enum local_684;
  undefined1 local_680 [8];
  Values results;
  undefined1 local_660 [8];
  Ptr func;
  StartDesc *start;
  const_iterator __end2_8;
  const_iterator __begin2_8;
  vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_> *__range2_8;
  string local_610;
  Ptr local_5f0;
  Enum local_5d4;
  Enum local_5d0;
  Result local_5cc;
  undefined8 local_5c8;
  u64 local_5c0;
  undefined8 local_5b8;
  Value local_5b0;
  uint local_594;
  Ref RStack_590;
  u32 offset_1;
  undefined1 local_588 [8];
  Ptr memory;
  Result result_1;
  DataDesc *desc_9;
  DataSegment *segment_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_> *__range3_1;
  string local_528;
  Ptr local_508;
  Enum local_4ec;
  Enum local_4e8;
  Result local_4e4;
  undefined8 local_4e0;
  u64 local_4d8;
  undefined8 local_4d0;
  Value local_4c8;
  u32 local_4ac;
  Ref RStack_4a8;
  u32 offset;
  undefined1 local_4a0 [8];
  Ptr table;
  Result result;
  ElemDesc *desc_8;
  ElemSegment *segment;
  iterator __end3;
  iterator __begin3;
  vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_> *__range3;
  reference pDStack_450;
  int pass;
  reference local_448;
  DataDesc *desc_7;
  const_iterator __end2_7;
  const_iterator __begin2_7;
  vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_> *__range2_7;
  reference local_420;
  ElemDesc *desc_6;
  const_iterator __end2_6;
  const_iterator __begin2_6;
  vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *__range2_6;
  Ref ref;
  ExportDesc *desc_5;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_> *__range2_5;
  Ptr local_3b0;
  value_type local_398;
  EventType *local_390;
  EventDesc *desc_4;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_> *__range2_4;
  anon_union_16_6_113bff37_for_Value_0 local_358;
  undefined8 local_348;
  GlobalType local_340;
  Ptr local_328;
  value_type local_310;
  reference local_308;
  GlobalDesc *desc_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_> *__range2_3;
  Ptr local_2c0;
  value_type local_2a8;
  MemoryType *local_2a0;
  MemoryDesc *desc_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_> *__range2_2;
  Ptr local_258;
  value_type local_240;
  TableType *local_238;
  TableDesc *desc_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_> *__range2_1;
  Ref local_1b8;
  Ptr local_1b0;
  value_type local_198;
  reference local_190;
  FuncDesc *desc;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_> *__range2;
  undefined1 local_160 [8];
  Ptr extern_;
  string local_130;
  Ptr local_110;
  size_t local_f8;
  size_t local_f0;
  Ref local_e8;
  Ref extern_ref;
  value_type *import_desc;
  size_t i;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_c8;
  allocator local_a9;
  string local_a8;
  Ptr local_88;
  value_type *local_70;
  size_t import_desc_count;
  Ptr inst;
  undefined1 local_48 [8];
  Ptr mod;
  Ptr *out_trap_local;
  RefVec *imports_local;
  Store *store_local;
  Ref module_local;
  
  inst.root_index_ = module.index;
  mod.root_index_ = (Index)out_trap;
  store_local = (Store *)module.index;
  module_local.index = (size_t)__return_storage_ptr__;
  RefPtr<wabt::interp::Module>::RefPtr((RefPtr<wabt::interp::Module> *)local_48,store,module);
  Store::Alloc<wabt::interp::Instance,wabt::interp::Store&,wabt::interp::Ref&>
            ((RefPtr<wabt::interp::Instance> *)&import_desc_count,store,store,(Ref *)&store_local);
  pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
  pMVar6 = Module::desc(pMVar5);
  local_70 = (value_type *)
             std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::size
                       (&pMVar6->imports);
  pvVar7 = (value_type *)
           std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size(imports);
  if (pvVar7 < local_70) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a8,"not enough imports!",&local_a9);
    memset(&local_c8,0,0x18);
    std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector(&local_c8);
    Trap::New(&local_88,store,&local_a8,&local_c8);
    RefPtr<wabt::interp::Trap>::operator=((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_88);
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_88);
    std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector(&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
  }
  else {
    for (import_desc = (value_type *)0x0; import_desc < local_70;
        import_desc = (value_type *)&(import_desc->type).module.field_0x1) {
      pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
      pMVar6 = Module::desc(pMVar5);
      extern_ref.index =
           (size_t)std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                   ::operator[](&pMVar6->imports,(size_type)import_desc);
      pvVar8 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                         (imports,(size_type)import_desc);
      local_f0 = pvVar8->index;
      local_f8 = Ref::Null.index;
      local_e8.index = local_f0;
      bVar3 = interp::operator==((Ref)local_f0,Ref::Null);
      if (bVar3) {
        uVar9 = std::__cxx11::string::c_str();
        uVar10 = std::__cxx11::string::c_str();
        StringPrintf_abi_cxx11_(&local_130,"invalid import \"%s.%s\"",uVar9,uVar10);
        memset(&extern_.root_index_,0,0x18);
        std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
                  ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                   &extern_.root_index_);
        Trap::New(&local_110,store,&local_130,
                  (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                  &extern_.root_index_);
        RefPtr<wabt::interp::Trap>::operator=
                  ((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_110);
        RefPtr<wabt::interp::Trap>::~RefPtr(&local_110);
        std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector
                  ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                   &extern_.root_index_);
        std::__cxx11::string::~string((string *)&local_130);
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
        goto LAB_0028a17e;
      }
      RefPtr<wabt::interp::Extern>::RefPtr((RefPtr<wabt::interp::Extern> *)local_160,store,local_e8)
      ;
      pEVar11 = RefPtr<wabt::interp::Extern>::operator->((RefPtr<wabt::interp::Extern> *)local_160);
      result_00.enum_ =
           (*(pEVar11->super_Object)._vptr_Object[3])
                     (pEVar11,store,extern_ref.index,mod.root_index_);
      bVar3 = Failed(result_00);
      if (bVar3) {
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
        bVar3 = true;
      }
      else {
        pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                  (&pIVar12->imports_,&local_e8);
        pEVar13 = std::
                  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                  ::operator->((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                                *)(extern_ref.index + 0x40));
        switch(pEVar13->kind) {
        case First:
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar12->funcs_,&local_e8);
          break;
        case Table:
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar12->tables_,&local_e8);
          break;
        case Memory:
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar12->memories_,&local_e8);
          break;
        case Global:
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar12->globals_,&local_e8);
          break;
        case Event:
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar12->events_,&local_e8);
        }
        bVar3 = false;
      }
      RefPtr<wabt::interp::Extern>::~RefPtr((RefPtr<wabt::interp::Extern> *)local_160);
      if (bVar3) goto LAB_0028a17e;
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2 = std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::begin
                       (&pMVar6->funcs);
    desc = (FuncDesc *)
           std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::end
                     (&pMVar6->funcs);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
                                       *)&desc), bVar3) {
      local_190 = __gnu_cxx::
                  __normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
                  ::operator*(&__end2);
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      local_1b8 = RefPtr<wabt::interp::Instance>::ref
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      FuncDesc::FuncDesc((FuncDesc *)&__range2_1,local_190);
      DefinedFunc::New(&local_1b0,store,local_1b8,(FuncDesc *)&__range2_1);
      local_198.index = (size_t)RefPtr<wabt::interp::DefinedFunc>::ref(&local_1b0);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar12->funcs_,&local_198);
      RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_1b0);
      FuncDesc::~FuncDesc((FuncDesc *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
      ::operator++(&__end2);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_1 = std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::begin
                         (&pMVar6->tables);
    desc_1 = (TableDesc *)
             std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::end
                       (&pMVar6->tables);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_wabt::interp::TableDesc_*,_std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>_>
                               *)&desc_1), bVar3) {
      local_238 = &__gnu_cxx::
                   __normal_iterator<const_wabt::interp::TableDesc_*,_std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>_>
                   ::operator*(&__end2_1)->type;
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      TableType::TableType((TableType *)&__range2_2,local_238);
      Table::New(&local_258,store,(TableType *)&__range2_2);
      local_240.index = (size_t)RefPtr<wabt::interp::Table>::ref(&local_258);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar12->tables_,&local_240);
      RefPtr<wabt::interp::Table>::~RefPtr(&local_258);
      TableType::~TableType((TableType *)&__range2_2);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::TableDesc_*,_std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>_>
      ::operator++(&__end2_1);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_2 = std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::
               begin(&pMVar6->memories);
    desc_2 = (MemoryDesc *)
             std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::end
                       (&pMVar6->memories);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_wabt::interp::MemoryDesc_*,_std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>_>
                               *)&desc_2), bVar3) {
      local_2a0 = &__gnu_cxx::
                   __normal_iterator<const_wabt::interp::MemoryDesc_*,_std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>_>
                   ::operator*(&__end2_2)->type;
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      MemoryType::MemoryType((MemoryType *)&__range2_3,local_2a0);
      Memory::New(&local_2c0,store,(MemoryType *)&__range2_3);
      local_2a8.index = (size_t)RefPtr<wabt::interp::Memory>::ref(&local_2c0);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar12->memories_,&local_2a8);
      RefPtr<wabt::interp::Memory>::~RefPtr(&local_2c0);
      MemoryType::~MemoryType((MemoryType *)&__range2_3);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::MemoryDesc_*,_std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>_>
      ::operator++(&__end2_2);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_3 = std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::
               begin(&pMVar6->globals);
    desc_3 = (GlobalDesc *)
             std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::end
                       (&pMVar6->globals);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<const_wabt::interp::GlobalDesc_*,_std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>_>
                               *)&desc_3), bVar3) {
      local_308 = __gnu_cxx::
                  __normal_iterator<const_wabt::interp::GlobalDesc_*,_std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>_>
                  ::operator*(&__end2_3);
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      GlobalType::GlobalType(&local_340,&local_308->type);
      this = RefPtr<wabt::interp::Instance>::operator->
                       ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      ResolveInitExpr((Value *)&local_358.v128_,this,store,local_308->init);
      value.field_0._8_8_ = local_358._8_8_;
      value.field_0.i64_ = local_358.i64_;
      value._16_8_ = local_348;
      Global::New(&local_328,store,&local_340,value);
      local_310.index = (size_t)RefPtr<wabt::interp::Global>::ref(&local_328);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar12->globals_,&local_310);
      RefPtr<wabt::interp::Global>::~RefPtr(&local_328);
      GlobalType::~GlobalType(&local_340);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::GlobalDesc_*,_std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>_>
      ::operator++(&__end2_3);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_4 = std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>::begin
                         (&pMVar6->events);
    desc_4 = (EventDesc *)
             std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>::end
                       (&pMVar6->events);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<const_wabt::interp::EventDesc_*,_std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>_>
                               *)&desc_4), bVar3) {
      local_390 = &__gnu_cxx::
                   __normal_iterator<const_wabt::interp::EventDesc_*,_std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>_>
                   ::operator*(&__end2_4)->type;
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      EventType::EventType((EventType *)&__range2_5,local_390);
      Event::New(&local_3b0,store,(EventType *)&__range2_5);
      local_398.index = (size_t)RefPtr<wabt::interp::Event>::ref(&local_3b0);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar12->events_,&local_398);
      RefPtr<wabt::interp::Event>::~RefPtr(&local_3b0);
      EventType::~EventType((EventType *)&__range2_5);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::EventDesc_*,_std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>_>
      ::operator++(&__end2_4);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_5 = std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::
               begin(&pMVar6->exports);
    desc_5 = (ExportDesc *)
             std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::end
                       (&pMVar6->exports);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_5,
                              (__normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
                               *)&desc_5), bVar3) {
      ref.index = (size_t)__gnu_cxx::
                          __normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
                          ::operator*(&__end2_5);
      pEVar13 = std::
                unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                ::operator->(&(((reference)ref.index)->type).type);
      switch(pEVar13->kind) {
      case First:
        pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar18 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar12->funcs_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar18->index;
        break;
      case Table:
        pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar18 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar12->tables_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar18->index;
        break;
      case Memory:
        pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar18 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar12->memories_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar18->index;
        break;
      case Global:
        pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar18 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar12->globals_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar18->index;
        break;
      case Event:
        pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar18 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar12->events_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar18->index;
      }
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar12->exports_,(value_type *)&__range2_6);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
      ::operator++(&__end2_5);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_6 = std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::begin
                         (&pMVar6->elems);
    desc_6 = (ElemDesc *)
             std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::end
                       (&pMVar6->elems);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_6,
                              (__normal_iterator<const_wabt::interp::ElemDesc_*,_std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>_>
                               *)&desc_6), bVar3) {
      local_420 = __gnu_cxx::
                  __normal_iterator<const_wabt::interp::ElemDesc_*,_std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>_>
                  ::operator*(&__end2_6);
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __range2_7 = (vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_> *)
                   local_420;
      std::vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>>::
      emplace_back<wabt::interp::ElemDesc_const*,wabt::interp::RefPtr<wabt::interp::Instance>&>
                ((vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>> *)
                 &pIVar12->elems_,(ElemDesc **)&__range2_7,
                 (RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::ElemDesc_*,_std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>_>
      ::operator++(&__end2_6);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_7 = std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::begin
                         (&pMVar6->datas);
    desc_7 = (DataDesc *)
             std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::end
                       (&pMVar6->datas);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_7,
                              (__normal_iterator<const_wabt::interp::DataDesc_*,_std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>_>
                               *)&desc_7), bVar3) {
      local_448 = __gnu_cxx::
                  __normal_iterator<const_wabt::interp::DataDesc_*,_std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>_>
                  ::operator*(&__end2_7);
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      pDStack_450 = local_448;
      std::vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>>::
      emplace_back<wabt::interp::DataDesc_const*>
                ((vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>> *)
                 &pIVar12->datas_,&stack0xfffffffffffffbb0);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::DataDesc_*,_std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>_>
      ::operator++(&__end2_7);
    }
    this_00 = Store::features(store);
    bVar3 = Features::bulk_memory_enabled(this_00);
    for (__range3._4_4_ = (uint)bVar3; (int)__range3._4_4_ < 2; __range3._4_4_ = __range3._4_4_ + 1)
    {
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __end3 = std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>::
               begin(&pIVar12->elems_);
      segment = (ElemSegment *)
                std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>::
                end(&pIVar12->elems_);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
                                         *)&segment), bVar3) {
        this_01 = __gnu_cxx::
                  __normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
                  ::operator*(&__end3);
        pEVar14 = ElemSegment::desc(this_01);
        if (pEVar14->mode == Active) {
          Result::Result((Result *)((long)&table.root_index_ + 4));
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          pvVar18 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                              (&pIVar12->tables_,(ulong)pEVar14->table_index);
          RStack_4a8.index = pvVar18->index;
          RefPtr<wabt::interp::Table>::RefPtr
                    ((RefPtr<wabt::interp::Table> *)local_4a0,store,RStack_4a8);
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          local_4e0 = *(undefined8 *)&pEVar14->offset;
          local_4d8 = (pEVar14->offset).field_1.i64_;
          local_4d0 = *(undefined8 *)((long)&(pEVar14->offset).field_1 + 8);
          ResolveInitExpr(&local_4c8,pIVar12,store,pEVar14->offset);
          local_4ac = Value::Get<unsigned_int>(&local_4c8);
          if (__range3._4_4_ == 0) {
            pTVar15 = RefPtr<wabt::interp::Table>::operator->
                                ((RefPtr<wabt::interp::Table> *)local_4a0);
            uVar2 = local_4ac;
            uVar4 = ElemSegment::size(this_01);
            bVar3 = Table::IsValidRange(pTVar15,uVar2,uVar4);
            Result::Result(&local_4e4,(uint)!bVar3);
            table.root_index_._4_4_ = local_4e4.enum_;
          }
          else {
            pTVar15 = RefPtr<wabt::interp::Table>::operator->
                                ((RefPtr<wabt::interp::Table> *)local_4a0);
            uVar2 = local_4ac;
            uVar4 = ElemSegment::size(this_01);
            local_4e8 = (Enum)Table::Init(pTVar15,store,uVar2,this_01,0,uVar4);
            table.root_index_._4_4_ = (Result)local_4e8;
            ElemSegment::Drop(this_01);
          }
          local_4ec = table.root_index_._4_4_;
          bVar3 = Failed(table.root_index_._4_4_);
          uVar2 = local_4ac;
          if (bVar3) {
            uVar16 = (ulong)local_4ac;
            uVar4 = ElemSegment::size(this_01);
            pTVar15 = RefPtr<wabt::interp::Table>::operator->
                                ((RefPtr<wabt::interp::Table> *)local_4a0);
            Table::size(pTVar15);
            StringPrintf_abi_cxx11_
                      (&local_528,
                       "out of bounds table access: elem segment is out of bounds: [%u, %lu) >= max value %u"
                       ,(ulong)uVar2,uVar16 + uVar4);
            memset(&__range3_1,0,0x18);
            std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
                      ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                       &__range3_1);
            Trap::New(&local_508,store,&local_528,
                      (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                      &__range3_1);
            RefPtr<wabt::interp::Trap>::operator=
                      ((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_508);
            RefPtr<wabt::interp::Trap>::~RefPtr(&local_508);
            std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector
                      ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                       &__range3_1);
            std::__cxx11::string::~string((string *)&local_528);
            RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
          }
          RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_4a0);
          if (bVar3) goto LAB_0028a17e;
        }
        else if (pEVar14->mode == Declared) {
          ElemSegment::Drop(this_01);
        }
        __gnu_cxx::
        __normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
        ::operator++(&__end3);
      }
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __end3_1 = std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                 ::begin(&pIVar12->datas_);
      segment_1 = (DataSegment *)
                  std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                  ::end(&pIVar12->datas_);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<wabt::interp::DataSegment_*,_std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>_>
                                 *)&segment_1), bVar3) {
        this_02 = __gnu_cxx::
                  __normal_iterator<wabt::interp::DataSegment_*,_std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>_>
                  ::operator*(&__end3_1);
        pDVar17 = DataSegment::desc(this_02);
        if (pDVar17->mode == Active) {
          Result::Result((Result *)((long)&memory.root_index_ + 4));
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          pvVar18 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                              (&pIVar12->memories_,(ulong)pDVar17->memory_index);
          RStack_590.index = pvVar18->index;
          RefPtr<wabt::interp::Memory>::RefPtr
                    ((RefPtr<wabt::interp::Memory> *)local_588,store,RStack_590);
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          local_5c8 = *(undefined8 *)&pDVar17->offset;
          local_5c0 = (pDVar17->offset).field_1.i64_;
          local_5b8 = *(undefined8 *)((long)&(pDVar17->offset).field_1 + 8);
          ResolveInitExpr(&local_5b0,pIVar12,store,pDVar17->offset);
          local_594 = Value::Get<unsigned_int>(&local_5b0);
          if (__range3._4_4_ == 0) {
            pMVar19 = RefPtr<wabt::interp::Memory>::operator->
                                ((RefPtr<wabt::interp::Memory> *)local_588);
            uVar16 = (ulong)local_594;
            uVar20 = DataSegment::size(this_02);
            bVar3 = Memory::IsValidAccess(pMVar19,uVar16,0,uVar20);
            Result::Result(&local_5cc,(uint)!bVar3);
            memory.root_index_._4_4_ = local_5cc.enum_;
          }
          else {
            pMVar19 = RefPtr<wabt::interp::Memory>::operator->
                                ((RefPtr<wabt::interp::Memory> *)local_588);
            uVar16 = (ulong)local_594;
            uVar20 = DataSegment::size(this_02);
            local_5d0 = (Enum)Memory::Init(pMVar19,uVar16,this_02,0,uVar20);
            memory.root_index_._4_4_ = (Result)local_5d0;
            DataSegment::Drop(this_02);
          }
          local_5d4 = memory.root_index_._4_4_;
          bVar3 = Failed(memory.root_index_._4_4_);
          uVar1 = local_594;
          if (bVar3) {
            uVar16 = (ulong)local_594;
            uVar20 = DataSegment::size(this_02);
            pMVar19 = RefPtr<wabt::interp::Memory>::operator->
                                ((RefPtr<wabt::interp::Memory> *)local_588);
            Memory::ByteSize(pMVar19);
            StringPrintf_abi_cxx11_
                      (&local_610,
                       "out of bounds memory access: data segment is out of bounds: [%u, %lu) >= max value %lu"
                       ,(ulong)uVar1,uVar16 + uVar20);
            memset(&__range2_8,0,0x18);
            std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
                      ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                       &__range2_8);
            Trap::New(&local_5f0,store,&local_610,
                      (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                      &__range2_8);
            RefPtr<wabt::interp::Trap>::operator=
                      ((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_5f0);
            RefPtr<wabt::interp::Trap>::~RefPtr(&local_5f0);
            std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector
                      ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                       &__range2_8);
            std::__cxx11::string::~string((string *)&local_610);
            RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
          }
          RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_588);
          if (bVar3) goto LAB_0028a17e;
        }
        else if (pDVar17->mode == Declared) {
          DataSegment::Drop(this_02);
        }
        __gnu_cxx::
        __normal_iterator<wabt::interp::DataSegment_*,_std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>_>
        ::operator++(&__end3_1);
      }
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_8 = std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::begin
                         (&pMVar6->starts);
    start = (StartDesc *)
            std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::end
                      (&pMVar6->starts);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_8,
                              (__normal_iterator<const_wabt::interp::StartDesc_*,_std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>_>
                               *)&start), bVar3) {
      func.root_index_ =
           (Index)__gnu_cxx::
                  __normal_iterator<const_wabt::interp::StartDesc_*,_std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>_>
                  ::operator*(&__end2_8);
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      pvVar18 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                          (&pIVar12->funcs_,(ulong)*(uint *)func.root_index_);
      results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pvVar18->index;
      RefPtr<wabt::interp::Func>::RefPtr
                ((RefPtr<wabt::interp::Func> *)local_660,store,
                 (Ref)results.
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
                ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)local_680);
      this_03 = RefPtr<wabt::interp::Func>::operator->((RefPtr<wabt::interp::Func> *)local_660);
      memset(&local_6a0,0,0x18);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector(&local_6a0);
      local_684 = (Enum)Func::Call(this_03,store,&local_6a0,(Values *)local_680,
                                   (Ptr *)mod.root_index_,(Stream *)0x0);
      bVar3 = Failed((Result)local_684);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&local_6a0);
      if (bVar3) {
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
      }
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
                ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)local_680);
      RefPtr<wabt::interp::Func>::~RefPtr((RefPtr<wabt::interp::Func> *)local_660);
      if (bVar3) goto LAB_0028a17e;
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::StartDesc_*,_std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>_>
      ::operator++(&__end2_8);
    }
    RefPtr<wabt::interp::Instance>::RefPtr
              (__return_storage_ptr__,(RefPtr<wabt::interp::Instance> *)&import_desc_count);
  }
LAB_0028a17e:
  RefPtr<wabt::interp::Instance>::~RefPtr((RefPtr<wabt::interp::Instance> *)&import_desc_count);
  RefPtr<wabt::interp::Module>::~RefPtr((RefPtr<wabt::interp::Module> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Instance::Ptr Instance::Instantiate(Store& store,
                                    Ref module,
                                    const RefVec& imports,
                                    Trap::Ptr* out_trap) {
  Module::Ptr mod{store, module};
  Instance::Ptr inst = store.Alloc<Instance>(store, module);

  size_t import_desc_count = mod->desc().imports.size();
  if (imports.size() < import_desc_count) {
    *out_trap = Trap::New(store, "not enough imports!");
    return {};
  }

  // Imports.
  for (size_t i = 0; i < import_desc_count; ++i) {
    auto&& import_desc = mod->desc().imports[i];
    Ref extern_ref = imports[i];
    if (extern_ref == Ref::Null) {
      *out_trap = Trap::New(store, StringPrintf("invalid import \"%s.%s\"",
                                                import_desc.type.module.c_str(),
                                                import_desc.type.name.c_str()));
      return {};
    }

    Extern::Ptr extern_{store, extern_ref};
    if (Failed(extern_->Match(store, import_desc.type, out_trap))) {
      return {};
    }

    inst->imports_.push_back(extern_ref);

    switch (import_desc.type.type->kind) {
      case ExternKind::Func:   inst->funcs_.push_back(extern_ref); break;
      case ExternKind::Table:  inst->tables_.push_back(extern_ref); break;
      case ExternKind::Memory: inst->memories_.push_back(extern_ref); break;
      case ExternKind::Global: inst->globals_.push_back(extern_ref); break;
      case ExternKind::Event:  inst->events_.push_back(extern_ref); break;
    }
  }

  // Funcs.
  for (auto&& desc : mod->desc().funcs) {
    inst->funcs_.push_back(DefinedFunc::New(store, inst.ref(), desc).ref());
  }

  // Tables.
  for (auto&& desc : mod->desc().tables) {
    inst->tables_.push_back(Table::New(store, desc.type).ref());
  }

  // Memories.
  for (auto&& desc : mod->desc().memories) {
    inst->memories_.push_back(Memory::New(store, desc.type).ref());
  }

  // Globals.
  for (auto&& desc : mod->desc().globals) {
    inst->globals_.push_back(
        Global::New(store, desc.type, inst->ResolveInitExpr(store, desc.init))
            .ref());
  }

  // Events.
  for (auto&& desc : mod->desc().events) {
    inst->events_.push_back(Event::New(store, desc.type).ref());
  }

  // Exports.
  for (auto&& desc : mod->desc().exports){
    Ref ref;
    switch (desc.type.type->kind) {
      case ExternKind::Func:   ref = inst->funcs_[desc.index]; break;
      case ExternKind::Table:  ref = inst->tables_[desc.index]; break;
      case ExternKind::Memory: ref = inst->memories_[desc.index]; break;
      case ExternKind::Global: ref = inst->globals_[desc.index]; break;
      case ExternKind::Event:  ref = inst->events_[desc.index]; break;
    }
    inst->exports_.push_back(ref);
  }

  // Elems.
  for (auto&& desc : mod->desc().elems) {
    inst->elems_.emplace_back(&desc, inst);
  }

  // Datas.
  for (auto&& desc : mod->desc().datas) {
    inst->datas_.emplace_back(&desc);
  }

  // Initialization.
  enum Pass { Check, Init };
  int pass = store.features().bulk_memory_enabled() ? Init : Check;
  for (; pass <= Init; ++pass) {
    // Elems.
    for (auto&& segment : inst->elems_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Table::Ptr table{store, inst->tables_[desc.table_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = table->IsValidRange(offset, segment.size()) ? Result::Ok
                                                               : Result::Error;
        } else {
          result = table->Init(store, offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds table access: elem segment is "
                         "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                         offset, u64{offset} + segment.size(), table->size()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }

    // Data.
    for (auto&& segment : inst->datas_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Memory::Ptr memory{store, inst->memories_[desc.memory_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = memory->IsValidAccess(offset, 0, segment.size())
                       ? Result::Ok
                       : Result::Error;
        } else {
          result = memory->Init(offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store,
              StringPrintf("out of bounds memory access: data segment is "
                           "out of bounds: [%u, %" PRIu64 ") >= max value %"
                           PRIu64, offset, u64{offset} + segment.size(),
                           memory->ByteSize()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }
  }

  // Start.
  for (auto&& start : mod->desc().starts) {
    Func::Ptr func{store, inst->funcs_[start.func_index]};
    Values results;
    if (Failed(func->Call(store, {}, results, out_trap))) {
      return {};
    }
  }

  return inst;
}